

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void grabMouseForWidget(QWidget *widget,QCursor *cursor)

{
  QWidget *pQVar1;
  long lVar2;
  
  if (qt_mouseGrb != (QWidget *)0x0) {
    QWidget::releaseMouse(qt_mouseGrb);
  }
  mouseGrabWithCursor = 0;
  lVar2 = *(long *)(*(long *)&widget->field_0x8 + 0x78);
  pQVar1 = widget;
  if (((lVar2 == 0) || (lVar2 = *(long *)(lVar2 + 8), lVar2 == 0)) ||
     (lVar2 = *(long *)(lVar2 + 0x20), lVar2 == 0)) {
    do {
      pQVar1 = *(QWidget **)(*(long *)&pQVar1->field_0x8 + 0x10);
      if (pQVar1 == (QWidget *)0x0) {
        qt_mouseGrb = widget;
        mouseGrabWithCursor = 0;
        return;
      }
    } while (pQVar1->data->winid == 0);
    lVar2 = *(long *)(*(long *)&pQVar1->field_0x8 + 0x78);
    if (lVar2 == 0) {
      qt_mouseGrb = widget;
      mouseGrabWithCursor = 0;
      return;
    }
    lVar2 = *(long *)(lVar2 + 8);
    if (lVar2 == 0) {
      qt_mouseGrb = widget;
      mouseGrabWithCursor = 0;
      return;
    }
    lVar2 = *(long *)(lVar2 + 0x20);
    if (lVar2 == 0) {
      qt_mouseGrb = widget;
      mouseGrabWithCursor = 0;
      return;
    }
  }
  if (cursor != (QCursor *)0x0) {
    mouseGrabWithCursor = 1;
    QGuiApplication::setOverrideCursor(cursor);
  }
  QWindow::setMouseGrabEnabled(SUB81(lVar2,0));
  qt_mouseGrb = widget;
  return;
}

Assistant:

static void grabMouseForWidget(QWidget *widget)
#endif
{
    if (qt_mouseGrb)
        qt_mouseGrb->releaseMouse();

    mouseGrabWithCursor = false;
    if (QWindow *window = grabberWindow(widget)) {
#ifndef QT_NO_CURSOR
        if (cursor) {
            mouseGrabWithCursor = true;
            QGuiApplication::setOverrideCursor(*cursor);
        }
#endif // !QT_NO_CURSOR
        window->setMouseGrabEnabled(true);
    }

    qt_mouseGrb = widget;
}